

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O1

QNetworkReply * __thiscall
QNetworkAccessManager::sendCustomRequest
          (QNetworkAccessManager *this,QNetworkRequest *request,QByteArray *verb,QByteArray *data)

{
  QBuffer *this_00;
  QNetworkReply *pQVar1;
  
  this_00 = (QBuffer *)operator_new(0x10);
  QBuffer::QBuffer(this_00,(QObject *)0x0);
  QBuffer::setData((QByteArray *)this_00);
  (**(code **)(*(long *)this_00 + 0x68))(this_00,1);
  pQVar1 = sendCustomRequest(this,request,verb,(QIODevice *)this_00);
  QObject::setParent((QObject *)this_00);
  return pQVar1;
}

Assistant:

QNetworkReply *QNetworkAccessManager::sendCustomRequest(const QNetworkRequest &request, const QByteArray &verb, const QByteArray &data)
{
    QBuffer *buffer = new QBuffer;
    buffer->setData(data);
    buffer->open(QIODevice::ReadOnly);

    QNetworkReply *reply = sendCustomRequest(request, verb, buffer);
    buffer->setParent(reply);
    return reply;
}